

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sec_worker.h
# Opt level: O2

void __thiscall chain_of_responsibility::SecWorker::SecWorker(SecWorker *this)

{
  (this->super_IWorker).next_worker_.
  super___shared_ptr<chain_of_responsibility::IWorker,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->super_IWorker).next_worker_.
  super___shared_ptr<chain_of_responsibility::IWorker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_IWorker).name_._M_dataplus._M_p = (pointer)&(this->super_IWorker).name_.field_2;
  (this->super_IWorker).name_._M_string_length = 0;
  (this->super_IWorker).name_.field_2._M_local_buf[0] = '\0';
  (this->super_IWorker)._vptr_IWorker = (_func_int **)&PTR_HandlerRequest_00136a98;
  std::__cxx11::string::assign((char *)&(this->super_IWorker).name_);
  return;
}

Assistant:

SecWorker::SecWorker(/* args */) {
    name_ = "sec worker";
}